

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-twice.c
# Opt level: O2

void shutdown_cb(uv_shutdown_t *req,int status)

{
  char *__format;
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  if (req == &shutdown_req) {
    eval_a = (int64_t)status;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = (shutdown_req.handle)->write_queue_size;
      eval_b = 0;
      if (eval_a == 0) {
        shutdown_cb_called = shutdown_cb_called + 1;
        eval_a = (int64_t)write_cb_called;
        eval_b = 3;
        if (eval_a == 3) {
          return;
        }
        pcVar2 = "3";
        pcVar1 = "write_cb_called";
        uVar3 = 0x50;
      }
      else {
        pcVar2 = "0";
        pcVar1 = "tcp->write_queue_size";
        uVar3 = 0x4a;
      }
    }
    else {
      pcVar2 = "0";
      pcVar1 = "status";
      uVar3 = 0x45;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar1 = "req";
    uVar3 = 0x44;
    pcVar2 = "&shutdown_req";
    eval_a = (int64_t)req;
    eval_b = (int64_t)&shutdown_req;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
          ,uVar3,pcVar1,"==",pcVar2,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void shutdown_cb(uv_shutdown_t* req, int status) {
  ASSERT_PTR_EQ(req, &req1);
  ASSERT_OK(status);
  shutdown_cb_called++;
  uv_close((uv_handle_t*) req->handle, close_cb);
}